

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evmap.c
# Opt level: O2

int evmap_io_del_(event_base *base,int fd,event *ev)

{
  ushort uVar1;
  ushort uVar2;
  void *pvVar3;
  event **ppeVar4;
  short sVar5;
  short sVar6;
  int iVar7;
  ushort uVar8;
  undefined8 uVar9;
  event *peVar10;
  uint uVar11;
  char *pcVar12;
  uint uVar13;
  uint uVar14;
  bool bVar15;
  
  if (fd < 0) {
    iVar7 = 0;
  }
  else {
    if (ev->ev_fd != fd) {
      pcVar12 = "fd == ev->ev_fd";
      uVar9 = 0x16d;
LAB_00267db3:
      event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/evmap.c"
                 ,uVar9,pcVar12,"evmap_io_del_");
    }
    if (fd < (base->io).nentries) {
      pvVar3 = (base->io).entries[(uint)fd];
      uVar1 = *(ushort *)((long)pvVar3 + 8);
      uVar14 = (uint)uVar1;
      bVar15 = uVar1 != 0;
      sVar5 = bVar15 + 4 + (ushort)bVar15;
      if (*(ushort *)((long)pvVar3 + 10) == 0) {
        sVar5 = (ushort)bVar15 * 2;
      }
      sVar6 = sVar5 + 0x80;
      if (*(ushort *)((long)pvVar3 + 0xc) == 0) {
        sVar6 = sVar5;
      }
      uVar2 = ev->ev_events;
      uVar8 = 0;
      if ((uVar2 & 2) != 0) {
        uVar14 = uVar1 - 1;
        if (uVar1 == 0) {
          pcVar12 = "nread >= 0";
          uVar9 = 0x184;
          goto LAB_00267db3;
        }
        uVar8 = (ushort)(uVar14 == 0) * 2;
      }
      uVar13 = (uint)*(ushort *)((long)pvVar3 + 10);
      if ((uVar2 & 4) != 0) {
        if (uVar13 - 1 == 0) {
          uVar8 = uVar8 + 4;
        }
        bVar15 = uVar13 == 0;
        uVar13 = uVar13 - 1;
        if (bVar15) {
          pcVar12 = "nwrite >= 0";
          uVar9 = 0x189;
          goto LAB_00267db3;
        }
      }
      uVar11 = (uint)*(ushort *)((long)pvVar3 + 0xc);
      if ((char)uVar2 < '\0') {
        if (uVar11 - 1 == 0) {
          uVar8 = uVar8 + 0x80;
        }
        bVar15 = uVar11 == 0;
        uVar11 = uVar11 - 1;
        if (bVar15) {
          pcVar12 = "nclose >= 0";
          uVar9 = 0x18e;
          goto LAB_00267db3;
        }
      }
      if (uVar8 == 0) {
        iVar7 = 0;
      }
      else {
        iVar7 = (*base->evsel->del)(base,fd,sVar6,uVar8 | uVar2 & 0x20,(void *)((long)pvVar3 + 0x10)
                                   );
        iVar7 = (uint)(iVar7 != -1) * 2 + -1;
      }
      *(short *)((long)pvVar3 + 8) = (short)uVar14;
      *(short *)((long)pvVar3 + 10) = (short)uVar13;
      *(short *)((long)pvVar3 + 0xc) = (short)uVar11;
      peVar10 = (ev->ev_).ev_io.ev_io_next.le_next;
      ppeVar4 = (ev->ev_).ev_io.ev_io_next.le_prev;
      if (peVar10 == (event *)0x0) {
        peVar10 = (event *)0x0;
      }
      else {
        (peVar10->ev_).ev_io.ev_io_next.le_prev = ppeVar4;
        peVar10 = (ev->ev_).ev_io.ev_io_next.le_next;
      }
      *ppeVar4 = peVar10;
    }
    else {
      iVar7 = -1;
    }
  }
  return iVar7;
}

Assistant:

int
evmap_io_del_(struct event_base *base, evutil_socket_t fd, struct event *ev)
{
	const struct eventop *evsel = base->evsel;
	struct event_io_map *io = &base->io;
	struct evmap_io *ctx;
	int nread, nwrite, nclose, retval = 0;
	short res = 0, old = 0;

	if (fd < 0)
		return 0;

	EVUTIL_ASSERT(fd == ev->ev_fd);

#ifndef EVMAP_USE_HT
	if (fd >= io->nentries)
		return (-1);
#endif

	GET_IO_SLOT(ctx, io, fd, evmap_io);

	nread = ctx->nread;
	nwrite = ctx->nwrite;
	nclose = ctx->nclose;

	if (nread)
		old |= EV_READ;
	if (nwrite)
		old |= EV_WRITE;
	if (nclose)
		old |= EV_CLOSED;

	if (ev->ev_events & EV_READ) {
		if (--nread == 0)
			res |= EV_READ;
		EVUTIL_ASSERT(nread >= 0);
	}
	if (ev->ev_events & EV_WRITE) {
		if (--nwrite == 0)
			res |= EV_WRITE;
		EVUTIL_ASSERT(nwrite >= 0);
	}
	if (ev->ev_events & EV_CLOSED) {
		if (--nclose == 0)
			res |= EV_CLOSED;
		EVUTIL_ASSERT(nclose >= 0);
	}

	if (res) {
		void *extra = ((char*)ctx) + sizeof(struct evmap_io);
		if (evsel->del(base, ev->ev_fd,
			old, (ev->ev_events & EV_ET) | res, extra) == -1) {
			retval = -1;
		} else {
			retval = 1;
		}
	}

	ctx->nread = nread;
	ctx->nwrite = nwrite;
	ctx->nclose = nclose;
	LIST_REMOVE(ev, ev_io_next);

	return (retval);
}